

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O3

String * __thiscall CommandLine::describeOptions(String *__return_storage_ptr__,CommandLine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  CommandLineOption *pCVar3;
  pointer pcVar4;
  String *pSVar5;
  int iVar6;
  _Map_pointer pppCVar7;
  int iVar8;
  ulong uVar9;
  _Elt_pointer ppCVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  _Elt_pointer pSVar14;
  _Map_pointer ppSVar15;
  String *line_1;
  _Elt_pointer pSVar16;
  _Elt_pointer ppCVar17;
  _Elt_pointer ppCVar18;
  _Map_pointer pppCVar19;
  String line;
  StringList lines;
  StringList extralines;
  String description;
  String *result;
  value_type local_1b0;
  CommandLine *local_190;
  _Deque_base<String,_std::allocator<String>_> local_188;
  _Deque_base<String,_std::allocator<String>_> local_138;
  String local_e8;
  _Map_pointer local_c8;
  String *local_c0;
  _Elt_pointer local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  String local_70;
  String local_50;
  
  local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_c0 = __return_storage_ptr__;
  std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map(&local_188,0);
  ppCVar10 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_b8 = (this->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  local_190 = this;
  if (ppCVar10 != local_b8) {
    ppCVar17 = (this->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_c8 = (this->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar2 = &local_138._M_impl.super__Deque_impl_data._M_start;
    do {
      pCVar3 = *ppCVar10;
      local_1b0._string._M_dataplus._M_p = (pointer)&local_1b0._string.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"  ","");
      pSVar14 = local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (pCVar3->_shortform == '\0') {
        std::__cxx11::string::append((char *)&local_1b0);
      }
      else {
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = SUB84(pSVar14,4);
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ =
             (uint)CONCAT11(pCVar3->_shortform,0x2d);
        local_138._M_impl.super__Deque_impl_data._M_map_size = 3;
        local_90[0] = local_80;
        local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,piVar2,
                   (undefined1 *)
                   ((long)&local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 3));
        std::__cxx11::string::append((char *)&local_1b0);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
          operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
        }
      }
      std::__cxx11::string::append((char *)&local_1b0);
      if (*(pCVar3->_longform)._string._M_dataplus._M_p != '\0') {
        local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"--","");
        String::operator+(&local_50,(String *)&local_138,&pCVar3->_longform);
        if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
          operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
        }
        std::__cxx11::string::append((char *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
          operator_delete(local_50._string._M_dataplus._M_p);
        }
        (*pCVar3->_vptr_CommandLineOption[3])(&local_e8,pCVar3);
        if (*local_e8._string._M_dataplus._M_p != '\0') {
          local_138._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"=","");
          String::operator+(&local_70,(String *)&local_138,&local_e8);
          if ((iterator *)local_138._M_impl.super__Deque_impl_data._M_map != piVar2) {
            operator_delete(local_138._M_impl.super__Deque_impl_data._M_map);
          }
          std::__cxx11::string::append((char *)&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
            operator_delete(local_70._string._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._string._M_dataplus._M_p != &local_e8._string.field_2) {
          operator_delete(local_e8._string._M_dataplus._M_p);
        }
      }
      std::deque<String,_std::allocator<String>_>::push_back
                ((deque<String,_std::allocator<String>_> *)&local_188,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._string._M_dataplus._M_p != &local_1b0._string.field_2) {
        operator_delete(local_1b0._string._M_dataplus._M_p);
      }
      ppCVar10 = ppCVar10 + 1;
      if (ppCVar10 == ppCVar17) {
        ppCVar10 = local_c8[1];
        local_c8 = local_c8 + 1;
        ppCVar17 = ppCVar10 + 0x40;
      }
    } while (ppCVar10 != local_b8);
  }
  if (local_188._M_impl.super__Deque_impl_data._M_start._M_cur ==
      local_188._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    iVar11 = 2;
  }
  else {
    iVar11 = 0;
    ppSVar15 = local_188._M_impl.super__Deque_impl_data._M_start._M_node;
    pSVar16 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur;
    pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      iVar6 = (int)(pSVar16->_string)._M_string_length;
      if (iVar6 < iVar11) {
        iVar6 = iVar11;
      }
      iVar11 = iVar6;
      pSVar16 = pSVar16 + 1;
      if (pSVar16 == pSVar14) {
        pSVar16 = ppSVar15[1];
        ppSVar15 = ppSVar15 + 1;
        pSVar14 = pSVar16 + 0x10;
      }
    } while (pSVar16 != local_188._M_impl.super__Deque_impl_data._M_finish._M_cur);
    iVar11 = iVar11 + 2;
  }
  iVar6 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
          (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
          ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          0x10;
  pppCVar19 = (local_190->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  iVar8 = (int)((ulong)((long)(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(local_190->_options)._deque.
                             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
          (int)((ulong)((long)(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(local_190->_options)._deque.
                             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)pppCVar19 -
                   *(int *)&(local_190->_options)._deque.
                            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(pppCVar19 == (_Map_pointer)0x0)) * 0x40;
  if (iVar6 != iVar8) {
    local_138._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
    local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:176: lines.size() (%1) does not equal _options.size() (%2)"
                   ,(int *)&local_138,(int *)&local_1b0);
  }
  iVar6 = 0;
LAB_00110fae:
  if ((int)((int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
            (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
           ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x10) <= iVar6) {
    local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<String,_std::allocator<String>_>::_M_initialize_map(&local_138,0);
    ppCVar10 = (local_190->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    ppCVar17 = (local_190->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    if (ppCVar10 != ppCVar17) {
      ppCVar18 = (local_190->_options)._deque.
                 super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppCVar19 = (local_190->_options)._deque.
                  super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        (*(*ppCVar10)->_vptr_CommandLineOption[4])(&local_1b0);
        if (*local_1b0._string._M_dataplus._M_p != '\0') {
          if ((int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
              (int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)local_138._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5)
              + ((((uint)((int)local_138._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)local_138._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                + (uint)(local_138._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 0x10 == 0) {
            local_e8._string._M_dataplus._M_p = (pointer)&local_e8._string.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
            std::deque<String,_std::allocator<String>_>::push_back
                      ((deque<String,_std::allocator<String>_> *)&local_138,(value_type *)&local_e8)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._string._M_dataplus._M_p != &local_e8._string.field_2) {
              operator_delete(local_e8._string._M_dataplus._M_p);
            }
          }
          std::deque<String,_std::allocator<String>_>::push_back
                    ((deque<String,_std::allocator<String>_> *)&local_138,&local_1b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._string._M_dataplus._M_p != &local_1b0._string.field_2) {
          operator_delete(local_1b0._string._M_dataplus._M_p);
        }
        ppCVar10 = ppCVar10 + 1;
        if (ppCVar10 == ppCVar18) {
          ppCVar10 = pppCVar19[1];
          pppCVar19 = pppCVar19 + 1;
          ppCVar18 = ppCVar10 + 0x40;
        }
      } while (ppCVar10 != ppCVar17);
    }
    List<String>::merge((List<String> *)&local_188,(List<String> *)&local_138);
    paVar1 = &local_1b0._string.field_2;
    local_1b0._string._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\n","");
    pSVar5 = local_c0;
    StringList::join(local_c0,(StringList *)&local_188,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._string._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0._string._M_dataplus._M_p);
    }
    std::deque<String,_std::allocator<String>_>::~deque
              ((deque<String,_std::allocator<String>_> *)&local_138);
    std::deque<String,_std::allocator<String>_>::~deque
              ((deque<String,_std::allocator<String>_> *)&local_188);
    return pSVar5;
  }
  do {
    iVar8 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
            (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
            ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x10;
    local_138._M_impl.super__Deque_impl_data._M_map._0_4_ = iVar6;
    if (iVar8 <= iVar6) {
      local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,(int *)&local_138,(int *)&local_1b0);
    }
    uVar13 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
             (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
    if ((long)uVar13 < 0) {
      uVar9 = (long)uVar13 >> 4;
LAB_0011109b:
      pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar9] +
                uVar13 + uVar9 * -0x10;
    }
    else {
      if (0xf < uVar13) {
        uVar9 = uVar13 >> 4;
        goto LAB_0011109b;
      }
      pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur +
                (int)local_138._M_impl.super__Deque_impl_data._M_map;
    }
    if (iVar11 <= (int)(pSVar14->_string)._M_string_length) break;
    local_138._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
    iVar12 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
             (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
             ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
             ) * 0x10;
    iVar8 = iVar6;
    if (iVar12 <= iVar6) {
      local_1b0._string._M_dataplus._M_p._0_4_ = iVar12;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,(int *)&local_138,(int *)&local_1b0);
      iVar8 = (int)local_138._M_impl.super__Deque_impl_data._M_map;
    }
    uVar13 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + (long)iVar8;
    if ((long)uVar13 < 0) {
      uVar9 = (long)uVar13 >> 4;
LAB_0011115c:
      pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar9] +
                uVar13 + uVar9 * -0x10;
    }
    else {
      if (0xf < uVar13) {
        uVar9 = uVar13 >> 4;
        goto LAB_0011115c;
      }
      pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur + iVar8;
    }
    std::__cxx11::string::append((char *)pSVar14);
  } while( true );
  pppCVar19 = (local_190->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  pppCVar7 = (local_190->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppCVar10 = (local_190->_options)._deque.
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  iVar8 = (int)((ulong)((long)(local_190->_options)._deque.
                              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppCVar10) >>
               3) + (int)((ulong)((long)(local_190->_options)._deque.
                                        super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(local_190->_options)._deque.
                                       super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)pppCVar19 - (int)pppCVar7) >> 3) - 1) +
          (uint)(pppCVar19 == (_Map_pointer)0x0)) * 0x40;
  local_138._M_impl.super__Deque_impl_data._M_map._0_4_ = iVar6;
  if (iVar8 <= iVar6) {
    local_1b0._string._M_dataplus._M_p._0_4_ = iVar8;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:264: n (%1) is not less than size() (%2)"
                   ,(int *)&local_138,(int *)&local_1b0);
    ppCVar10 = (local_190->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    pppCVar7 = (local_190->_options)._deque.
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
  }
  uVar13 = ((long)ppCVar10 -
            (long)(local_190->_options)._deque.
                  super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_first >> 3) +
           (long)(int)local_138._M_impl.super__Deque_impl_data._M_map;
  if ((long)uVar13 < 0) {
    uVar9 = (long)uVar13 >> 6;
LAB_00111224:
    ppCVar10 = pppCVar7[uVar9] + uVar13 + uVar9 * -0x40;
  }
  else {
    if (0x3f < uVar13) {
      uVar9 = uVar13 >> 6;
      goto LAB_00111224;
    }
    ppCVar10 = ppCVar10 + (int)local_138._M_impl.super__Deque_impl_data._M_map;
  }
  local_b0[0] = local_a0;
  pcVar4 = ((*ppCVar10)->_description)._string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar4,pcVar4 + ((*ppCVar10)->_description)._string._M_string_length
            );
  local_138._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)CONCAT44(local_138._M_impl.super__Deque_impl_data._M_map._4_4_,iVar6);
  iVar12 = (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
           (int)((ulong)((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
           ((((uint)((int)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (int)local_188._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (uint)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x10;
  iVar8 = iVar6;
  if (iVar12 <= iVar6) {
    local_1b0._string._M_dataplus._M_p._0_4_ = iVar12;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,(int *)&local_138,(int *)&local_1b0);
    iVar8 = (int)local_138._M_impl.super__Deque_impl_data._M_map;
  }
  uVar13 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + (long)iVar8;
  if ((long)uVar13 < 0) {
    uVar9 = (long)uVar13 >> 4;
  }
  else {
    if (uVar13 < 0x10) {
      pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur + iVar8;
      goto LAB_0011131d;
    }
    uVar9 = uVar13 >> 4;
  }
  pSVar14 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar9] +
            uVar13 + uVar9 * -0x10;
LAB_0011131d:
  std::__cxx11::string::append((char *)pSVar14);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  iVar6 = iVar6 + 1;
  goto LAB_00110fae;
}

Assistant:

String CommandLine::describeOptions() const
{
	StringList lines;

	for (CommandLineOption* option : _options)
	{
		String line ("  ");

		if (option->shortform() != '\0')
			line += String ({'-', option->shortform(), '\0'});
		else
			line += "  ";

		line += "  ";

		if (not option->longform().isEmpty())
		{
			line += "--" + option->longform();
			String description (option->describeArgument());

			if (not description.isEmpty())
				line += "=" + description;
		}

		lines << line;
	}

	int maxlength (0);

	for (String& line : lines)
		maxlength = max (maxlength, line.length());

	maxlength += 2;
	ASSERT_EQ (lines.size(), _options.size());

	for (int i = 0; i < lines.size(); ++i)
	{
		while (lines[i].length() < maxlength)
			lines[i] += " ";

		lines[i] += _options[i]->description();
	}

	StringList extralines;

	for (CommandLineOption* option : _options)
	{
		String extradata = option->describeExtra();

		if (not extradata.isEmpty())
		{
			if (extralines.isEmpty())
				extralines << "";

			extralines << extradata;
		}
	}

	lines.merge (extralines);
	String result (lines.join ("\n"));
	return result;
}